

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

bool __thiscall Js::FunctionProxy::IsClassConstructor(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo *pFVar3;
  undefined4 *puVar4;
  FunctionProxy *pFVar5;
  FunctionProxy *this_local;
  
  pFVar3 = GetFunctionInfo(this);
  if (pFVar3 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x568,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar3 = GetFunctionInfo(this);
  pFVar5 = FunctionInfo::GetFunctionProxy(pFVar3);
  if (pFVar5 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x569,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar3 = GetFunctionInfo(this);
  bVar2 = FunctionInfo::IsClassConstructor(pFVar3);
  return bVar2;
}

Assistant:

inline bool FunctionProxy::IsClassConstructor() const
    {
        Assert(GetFunctionInfo());
        Assert(GetFunctionInfo()->GetFunctionProxy() == this);
        return GetFunctionInfo()->IsClassConstructor();
    }